

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O1

void __thiscall FFT_Benchmark1e4_Test::TestBody(FFT_Benchmark1e4_Test *this)

{
  bool bVar1;
  int iVar2;
  value_type_conflict1 *__val;
  pointer plVar3;
  ulong uVar4;
  char *message;
  undefined1 local_a0 [8];
  vector<long_long,_std::allocator<long_long>_> res;
  vector<long_long,_std::allocator<long_long>_> want;
  AssertionResult gtest_ar;
  undefined1 auStack_58 [8];
  vector<long_long,_std::allocator<long_long>_> p1;
  undefined1 auStack_38 [8];
  vector<long_long,_std::allocator<long_long>_> p2;
  
  auStack_58 = (undefined1  [8])0x0;
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])operator_new(80000);
  plVar3 = (pointer)((long)auStack_58 + 80000);
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auStack_58;
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = plVar3;
  memset((void *)auStack_58,0,80000);
  p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_38 = (undefined1  [8])0x0;
  p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = plVar3;
  auStack_38 = (undefined1  [8])operator_new(80000);
  plVar3 = (pointer)((long)auStack_38 + 80000);
  p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auStack_38;
  p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = plVar3;
  memset((void *)auStack_38,0,80000);
  p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = plVar3;
  if ((undefined1  [8])
      p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_start != auStack_58) {
    uVar4 = 0;
    do {
      iVar2 = rand();
      *(long *)((long)auStack_58 + uVar4 * 8) = (long)(iVar2 % 200000 + -100000);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)p1.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3)
            );
  }
  if ((undefined1  [8])
      p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_start != auStack_38) {
    uVar4 = 0;
    do {
      iVar2 = rand();
      *(long *)((long)auStack_38 + uVar4 * 8) = (long)(iVar2 % 200000 + -100000);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)p2.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)auStack_38 >> 3)
            );
  }
  multiplyPolynomials((vector<long_long,_std::allocator<long_long>_> *)local_a0,
                      (vector<long_long,_std::allocator<long_long>_> *)auStack_58,
                      (vector<long_long,_std::allocator<long_long>_> *)auStack_38);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)auStack_58,10);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)auStack_38,10);
  multiplyNaive((vector<long_long,_std::allocator<long_long>_> *)
                &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<long_long,_std::allocator<long_long>_> *)auStack_58,
                (vector<long_long,_std::allocator<long_long>_> *)auStack_38);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)
             &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,10);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)local_a0,10);
  testing::internal::
  CmpHelperEQ<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            ((internal *)
             &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"want","res",
             (vector<long_long,_std::allocator<long_long>_> *)
             &res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<long_long,_std::allocator<long_long>_> *)local_a0);
  if ((char)want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message
              ((Message *)
               &p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/numerical/fft_test.cpp"
               ,0x44,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)
               &p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
        (**(code **)(*p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 8))();
      }
      p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(res.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_a0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_a0);
  }
  if (auStack_38 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_38);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58);
  }
  return;
}

Assistant:

TEST(FFT, Benchmark1e4) {
    int n = 1e4;
    int range = 1e5; //numbers from -range to range
    vector<ll> p1(n), p2(n);
    rep(j, 0, p1.size()) p1[j] = rand() % (2 * range) - range;
    rep(j, 0, p2.size()) p2[j] = rand() % (2 * range) - range;
    vector<ll> res = multiplyPolynomials(p1, p2);
    p1.resize(10), p2.resize(10);
    vector<ll> want = multiplyNaive(p1, p2);
    want.resize(10), res.resize(10);
    EXPECT_EQ(want, res);
}